

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *
fmt::v9::detail::make_arg<fmt::v9::basic_printf_context<fmt::v9::appender,char>,long_long>
          (longlong *value)

{
  longlong *in_RSI;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *in_RDI;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  longlong *arg_1;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *pbVar1;
  size_t local_30;
  
  pbVar1 = in_RDI;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::basic_format_arg
            (in_RDI);
  pbVar1->type_ = long_long_type;
  (pbVar1->value_).field_0.long_long_value = *in_RSI;
  (pbVar1->value_).field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T&& value) -> basic_format_arg<Context> {
  basic_format_arg<Context> arg;
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_value<Context>(value);
  return arg;
}